

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall bioparser::Parser<biosoup::NucleicAcid>::~Parser(Parser<biosoup::NucleicAcid> *this)

{
  Parser<biosoup::NucleicAcid> *this_local;
  
  this->_vptr_Parser = (_func_int **)&PTR__Parser_001c1880;
  std::vector<char,_std::allocator<char>_>::~vector(&this->storage_);
  std::vector<char,_std::allocator<char>_>::~vector(&this->buffer_);
  std::unique_ptr<gzFile_s,_int_(*)(gzFile_s_*)>::~unique_ptr(&this->file_);
  return;
}

Assistant:

virtual ~Parser() {}